

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall glcts::anon_unknown_0::UniformLocNonDec::~UniformLocNonDec(UniformLocNonDec *this)

{
  UniformLocNonDec *this_local;
  
  ExplicitUniformLocationCaseBase::~ExplicitUniformLocationCaseBase
            (&this->super_ExplicitUniformLocationCaseBase);
  return;
}

Assistant:

virtual long Run()
	{
		//layout (location = 0x0a) uniform vec4 u0;
		//layout (location = 010) uniform vec4  u1;
		std::vector<Uniform> uniforms;
		uniforms.push_back(
			Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(0x0a, Loc::Hex), DefOccurence::FSH_OR_CSH));
		uniforms.push_back(
			Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(010, Loc::Oct), DefOccurence::FSH_OR_CSH));
		return doRun(uniforms);
	}